

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<ot::commissioner::PendingOperationalDataset_const&>>,std::tuple<ot::commissioner::PendingOperationalDataset_const&>>
               (tuple<testing::Matcher<const_ot::commissioner::PendingOperationalDataset_&>_>
                *matchers,tuple<const_ot::commissioner::PendingOperationalDataset_&> *values,
               ostream *os)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<Matcher<const_PendingOperationalDataset_&>_>_> *p_Var2;
  ostream *poVar3;
  MatcherBase<const_ot::commissioner::PendingOperationalDataset_&> *this;
  string local_208;
  undefined1 local_1d8 [8];
  StringMatchResultListener listener;
  PendingOperationalDataset *value;
  type matcher;
  ostream *os_local;
  tuple<const_ot::commissioner::PendingOperationalDataset_&> *values_local;
  tuple<testing::Matcher<const_ot::commissioner::PendingOperationalDataset_&>_> *matchers_local;
  
  matcher.super_MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::PendingOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)os;
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<ot::commissioner::PendingOperationalDataset_const&>>,std::tuple<ot::commissioner::PendingOperationalDataset_const&>>
            (matchers,values,os);
  p_Var2 = std::get<0ul,testing::Matcher<ot::commissioner::PendingOperationalDataset_const&>>
                     (matchers);
  Matcher<const_ot::commissioner::PendingOperationalDataset_&>::Matcher
            ((Matcher<const_ot::commissioner::PendingOperationalDataset_&> *)&value,p_Var2);
  listener._400_8_ = std::get<0ul,ot::commissioner::PendingOperationalDataset_const&>(values);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1d8);
  bVar1 = MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>::MatchAndExplain
                    ((MatcherBase<const_ot::commissioner::PendingOperationalDataset_&> *)&value,
                     (PendingOperationalDataset *)listener._400_8_,(MatchResultListener *)local_1d8)
  ;
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)
                             matcher.
                             super_MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>.
                             impl_.
                             super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::PendingOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi,"  Expected arg #");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    std::operator<<(poVar3,": ");
    this = &std::get<0ul,testing::Matcher<ot::commissioner::PendingOperationalDataset_const&>>
                      (matchers)->
            super_MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>;
    MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>::DescribeTo
              (this,(ostream *)
                    matcher.super_MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>.
                    impl_.
                    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::PendingOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
    std::operator<<((ostream *)
                    matcher.super_MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>.
                    impl_.
                    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::PendingOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi,"\n           Actual: ");
    UniversalPrint<ot::commissioner::PendingOperationalDataset>
              ((PendingOperationalDataset *)listener._400_8_,
               (ostream *)
               matcher.super_MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::PendingOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    StringMatchResultListener::str_abi_cxx11_(&local_208,(StringMatchResultListener *)local_1d8);
    PrintIfNotEmpty(&local_208,
                    (ostream *)
                    matcher.super_MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>.
                    impl_.
                    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::PendingOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator<<((ostream *)
                    matcher.super_MatcherBase<const_ot::commissioner::PendingOperationalDataset_&>.
                    impl_.
                    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::PendingOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1d8);
  Matcher<const_ot::commissioner::PendingOperationalDataset_&>::~Matcher
            ((Matcher<const_ot::commissioner::PendingOperationalDataset_&> *)&value);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }